

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validate_extensions.cpp
# Opt level: O2

bool spvtools::val::anon_unknown_0::IsIntScalar
               (ValidationState_t *_,uint32_t id,bool must_len32,bool must_unsigned)

{
  uint uVar1;
  Instruction *this;
  bool bVar2;
  
  this = ValidationState_t::FindDef(_,id);
  if ((this == (Instruction *)0x0) || ((this->inst_).opcode != 0x15)) {
    bVar2 = false;
  }
  else {
    if (must_len32) {
      uVar1 = Instruction::GetOperandAs<unsigned_int>(this,1);
      if (uVar1 != 0x20 || !must_unsigned) {
        return uVar1 == 0x20;
      }
    }
    else if (!must_unsigned) {
      return true;
    }
    uVar1 = Instruction::GetOperandAs<unsigned_int>(this,2);
    bVar2 = uVar1 == 0;
  }
  return bVar2;
}

Assistant:

bool IsIntScalar(ValidationState_t& _, uint32_t id, bool must_len32,
                 bool must_unsigned) {
  auto type = _.FindDef(id);
  if (!type || type->opcode() != spv::Op::OpTypeInt) {
    return false;
  }

  if (must_len32 && type->GetOperandAs<uint32_t>(1) != 32) {
    return false;
  }

  return !must_unsigned || type->GetOperandAs<uint32_t>(2) == 0;
}